

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdio_transporter.cpp
# Opt level: O0

void __thiscall lscpp::stdio_transporter::reserve(stdio_transporter *this,size_t size)

{
  bool bVar1;
  char *__p;
  bool reallocate;
  size_t size_local;
  stdio_transporter *this_local;
  
  bVar1 = false;
  while (this->size_ < size) {
    bVar1 = true;
    this->size_ = this->size_ << 1;
  }
  if (bVar1) {
    __p = (char *)operator_new__(this->size_);
    std::unique_ptr<char[],std::default_delete<char[]>>::reset<char*,void>
              ((unique_ptr<char[],std::default_delete<char[]>> *)&this->data_,__p);
  }
  return;
}

Assistant:

void stdio_transporter::reserve(std::size_t size) {
  bool reallocate = false;
  while (size > size_) {
    reallocate = true;
    size_ *= 2;
  }
  if (reallocate)
    data_.reset(new char[size_]);
}